

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void argo::unparser::save
               (json *j,string *file_name,char *space,char *newline,char *indent,int indent_inc)

{
  json_io_exception *this;
  int *piVar1;
  stream_writer w;
  unparser u;
  ofstream os;
  byte abStack_210 [480];
  
  std::ofstream::ofstream(&os,(string *)file_name,_S_out);
  if ((abStack_210[*(long *)(_os + -0x18)] & 5) == 0) {
    stream_writer::stream_writer(&w,(ostream *)&os);
    u.m_writer = &w.super_writer;
    u.m_space = space;
    u.m_newline = newline;
    u.m_indent = indent;
    u.m_indent_inc = indent_inc;
    unparse(&u,j,0);
    std::ofstream::~ofstream(&os);
    return;
  }
  this = (json_io_exception *)__cxa_allocate_exception(0xd8);
  piVar1 = __errno_location();
  json_io_exception::json_io_exception(this,file_open_failed_e,*piVar1);
  __cxa_throw(this,&json_io_exception::typeinfo,std::exception::~exception);
}

Assistant:

void unparser::save(
        const json   &j,
        const string &file_name,
        const char   *space,
        const char   *newline,
        const char   *indent,
        int          indent_inc)
{
    ofstream os(file_name);

    if (os)
    {
        stream_writer w(&os);
        unparser u(w, space, newline, indent, indent_inc);
        u.unparse(j, 0);
    }
    else
    {
        throw json_io_exception(json_io_exception::file_open_failed_e, errno);
    }
}